

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeSorterSort(SortSubtask *pTask,SorterList *pList)

{
  undefined8 *puVar1;
  u8 uVar2;
  uint uVar3;
  SorterCompare p_Var4;
  undefined8 *__s;
  SorterRecord *pSVar5;
  SorterRecord *pSVar6;
  code *pcVar7;
  undefined8 *puVar8;
  long lVar9;
  SorterRecord *pSVar10;
  
  uVar3 = vdbeSortAllocUnpacked(pTask);
  if (uVar3 == 0) {
    pSVar5 = pList->pList;
    uVar2 = pTask->pSorter->typeMask;
    pcVar7 = vdbeSorterCompare;
    if (uVar2 == '\x02') {
      pcVar7 = vdbeSorterCompareText;
    }
    p_Var4 = vdbeSorterCompareInt;
    if (uVar2 != '\x01') {
      p_Var4 = pcVar7;
    }
    pTask->xCompare = p_Var4;
    __s = (undefined8 *)sqlite3Malloc(0x200);
    if (__s == (undefined8 *)0x0) {
      uVar3 = 7;
    }
    else {
      memset(__s,0,0x200);
      while (pSVar5 != (SorterRecord *)0x0) {
        pSVar10 = (SorterRecord *)pList->aMemory;
        if (pSVar10 == (SorterRecord *)0x0) {
          pSVar10 = (pSVar5->u).pNext;
        }
        else if (pSVar5 == pSVar10) {
          pSVar10 = (SorterRecord *)0x0;
        }
        else {
          pSVar10 = (SorterRecord *)((long)&pSVar10->nVal + (long)(pSVar5->u).iNext);
        }
        (pSVar5->u).pNext = (SorterRecord *)0x0;
        pSVar6 = (SorterRecord *)*__s;
        puVar8 = __s;
        while (pSVar6 != (SorterRecord *)0x0) {
          pSVar5 = vdbeSorterMerge(pTask,pSVar5,pSVar6);
          *puVar8 = 0;
          puVar1 = puVar8 + 1;
          puVar8 = puVar8 + 1;
          pSVar6 = (SorterRecord *)*puVar1;
        }
        *puVar8 = pSVar5;
        pSVar5 = pSVar10;
      }
      lVar9 = 0;
      pSVar5 = (SorterRecord *)0x0;
      do {
        pSVar10 = (SorterRecord *)__s[lVar9];
        pSVar6 = pSVar5;
        if ((pSVar10 != (SorterRecord *)0x0) && (pSVar6 = pSVar10, pSVar5 != (SorterRecord *)0x0)) {
          pSVar6 = vdbeSorterMerge(pTask,pSVar5,pSVar10);
        }
        lVar9 = lVar9 + 1;
        pSVar5 = pSVar6;
      } while (lVar9 != 0x40);
      pList->pList = pSVar6;
      sqlite3_free(__s);
      uVar3 = (uint)pTask->pUnpacked->errCode;
    }
  }
  return uVar3;
}

Assistant:

static int vdbeSorterSort(SortSubtask *pTask, SorterList *pList){
  int i;
  SorterRecord **aSlot;
  SorterRecord *p;
  int rc;

  rc = vdbeSortAllocUnpacked(pTask);
  if( rc!=SQLITE_OK ) return rc;

  p = pList->pList;
  pTask->xCompare = vdbeSorterGetCompare(pTask->pSorter);

  aSlot = (SorterRecord **)sqlite3MallocZero(64 * sizeof(SorterRecord *));
  if( !aSlot ){
    return SQLITE_NOMEM_BKPT;
  }

  while( p ){
    SorterRecord *pNext;
    if( pList->aMemory ){
      if( (u8*)p==pList->aMemory ){
        pNext = 0;
      }else{
        assert( p->u.iNext<sqlite3MallocSize(pList->aMemory) );
        pNext = (SorterRecord*)&pList->aMemory[p->u.iNext];
      }
    }else{
      pNext = p->u.pNext;
    }

    p->u.pNext = 0;
    for(i=0; aSlot[i]; i++){
      p = vdbeSorterMerge(pTask, p, aSlot[i]);
      aSlot[i] = 0;
    }
    aSlot[i] = p;
    p = pNext;
  }

  p = 0;
  for(i=0; i<64; i++){
    if( aSlot[i]==0 ) continue;
    p = p ? vdbeSorterMerge(pTask, p, aSlot[i]) : aSlot[i];
  }
  pList->pList = p;

  sqlite3_free(aSlot);
  assert( pTask->pUnpacked->errCode==SQLITE_OK 
       || pTask->pUnpacked->errCode==SQLITE_NOMEM 
  );
  return pTask->pUnpacked->errCode;
}